

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O3

void ucnv_extGetUnicodeSetString
               (UConverterSharedData *sharedData,int32_t *cx,USetAdder *sa,
               UConverterUnicodeSet which,int32_t minLength,UChar32 firstCP,UChar *s,int32_t length,
               int32_t sectionIndex,UErrorCode *pErrorCode)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined4 in_register_0000000c;
  undefined4 in_register_0000008c;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int32_t *piVar9;
  undefined4 in_stack_ffffffffffffffb0;
  
  lVar5 = CONCAT44(in_register_0000008c,firstCP);
  lVar7 = (long)length;
  iVar1 = *(int *)((long)&sharedData->staticData + 4);
  iVar2._0_1_ = sharedData->sharedDataCached;
  iVar2._1_1_ = sharedData->isReferenceCounted;
  iVar2._2_2_ = *(undefined2 *)&sharedData->field_0x1a;
  uVar6 = (ulong)*(ushort *)((long)(sharedData->mbcs).sbcsIndex + lVar7 * 2 + (long)iVar1 + -0x68);
  uVar3 = *(uint *)((long)(sharedData->mbcs).sbcsIndex + lVar7 * 4 + (long)iVar2 + -0x68);
  if ((((int)sa != 0) && ((uVar3 >> 0x1d & 1) == 0)) && ((int)which <= (int)(uVar3 >> 0x18 & 0x1f)))
  {
    if (2 - (uint)((uint)minLength < 0x10000) == (int)s) {
      (**(code **)(cx + 2))(*(undefined8 *)cx,minLength);
    }
    else {
      (**(code **)(cx + 6))
                (*(undefined8 *)cx,lVar5,(ulong)s & 0xffffffff,CONCAT44(in_register_0000000c,which))
      ;
    }
  }
  if (uVar6 != 0) {
    uVar8 = 0;
    piVar9 = cx;
    do {
      *(undefined2 *)(lVar5 + (long)(int)s * 2) =
           *(undefined2 *)
            ((long)(sharedData->mbcs).sbcsIndex + uVar8 * 2 + lVar7 * 2 + (long)iVar1 + -0x66);
      uVar3 = *(uint *)((long)(sharedData->mbcs).sbcsIndex +
                       uVar8 * 4 + lVar7 * 4 + (long)iVar2 + -100);
      if (uVar3 != 0) {
        if (uVar3 < 0x1000000) {
          ucnv_extGetUnicodeSetString
                    (sharedData,cx,(USetAdder *)((ulong)sa & 0xffffffff),which,minLength,firstCP,
                     (UChar *)(ulong)((int)s + 1),uVar3,(int32_t)piVar9,
                     (UErrorCode *)CONCAT44(which,in_stack_ffffffffffffffb0));
          cx = piVar9;
          piVar9 = cx;
        }
        else if ((((int)sa != 0) && ((uVar3 >> 0x1d & 1) == 0)) &&
                ((int)which <= (int)(uVar3 >> 0x18 & 0x1f))) {
          uVar4 = *(undefined8 *)cx;
          cx = piVar9;
          (**(code **)(piVar9 + 6))(uVar4,lVar5,(UChar *)(ulong)((int)s + 1));
          piVar9 = cx;
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  return;
}

Assistant:

static void
ucnv_extGetUnicodeSetString(const UConverterSharedData *sharedData,
                            const int32_t *cx,
                            const USetAdder *sa,
                            UConverterUnicodeSet which,
                            int32_t minLength,
                            UChar32 firstCP,
                            UChar s[UCNV_EXT_MAX_UCHARS], int32_t length,
                            int32_t sectionIndex,
                            UErrorCode *pErrorCode) {
    const UChar *fromUSectionUChars;
    const uint32_t *fromUSectionValues;

    uint32_t value;
    int32_t i, count;

    fromUSectionUChars=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_UCHARS_INDEX, UChar)+sectionIndex;
    fromUSectionValues=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_VALUES_INDEX, uint32_t)+sectionIndex;

    /* read first pair of the section */
    count=*fromUSectionUChars++;
    value=*fromUSectionValues++;

    if(extSetUseMapping(which, minLength, value)) {
        if(length==U16_LENGTH(firstCP)) {
            /* add the initial code point */
            sa->add(sa->set, firstCP);
        } else {
            /* add the string so far */
            sa->addString(sa->set, s, length);
        }
    }

    for(i=0; i<count; ++i) {
        /* append this code unit and recurse or add the string */
        s[length]=fromUSectionUChars[i];
        value=fromUSectionValues[i];

        if(value==0) {
            /* no mapping, do nothing */
        } else if(UCNV_EXT_FROM_U_IS_PARTIAL(value)) {
            ucnv_extGetUnicodeSetString(
                sharedData, cx, sa, which, minLength,
                firstCP, s, length+1,
                (int32_t)UCNV_EXT_FROM_U_GET_PARTIAL_INDEX(value),
                pErrorCode);
        } else if(extSetUseMapping(which, minLength, value)) {
            sa->addString(sa->set, s, length+1);
        }
    }
}